

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::Parser::ParseOption
          (Parser *this,Message *options,LocationRecorder *options_location,OptionStyle style)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  FieldDescriptor *pFVar5;
  LogMessage *pLVar6;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  Message *f;
  UninterpretedOption *uninterpreted_option;
  string *value;
  Parser *pPVar7;
  long lVar8;
  LocationRecorder *this_00;
  uint uVar9;
  LogFinisher local_91;
  LocationRecorder part_location;
  LocationRecorder name_location;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70 [2];
  OptionStyle local_44;
  LocationRecorder location;
  
  local_44 = style;
  iVar3 = (*(options->super_MessageLite)._vptr_MessageLite[0x13])(options);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name_location,"uninterpreted_option",(allocator<char> *)&location);
  pFVar5 = Descriptor::FindFieldByName
                     ((Descriptor *)CONCAT44(extraout_var,iVar3),(string *)&name_location);
  std::__cxx11::string::~string((string *)&name_location);
  if (pFVar5 == (FieldDescriptor *)0x0) {
    internal::LogMessage::LogMessage
              ((LogMessage *)&name_location,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/compiler/parser.cc"
               ,0x3c4);
    pLVar6 = internal::LogMessage::operator<<
                       ((LogMessage *)&name_location,
                        "CHECK failed: uninterpreted_option_field != NULL: ");
    pLVar6 = internal::LogMessage::operator<<
                       (pLVar6,"No field named \"uninterpreted_option\" in the Options proto.");
    internal::LogFinisher::operator=((LogFinisher *)&location,pLVar6);
    internal::LogMessage::~LogMessage((LogMessage *)&name_location);
  }
  iVar4 = (*(options->super_MessageLite)._vptr_MessageLite[0x12])(options);
  iVar3 = *(int *)(pFVar5 + 0x28);
  iVar4 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar4) + 0x30))
                    ((long *)CONCAT44(extraout_var_00,iVar4),options,pFVar5);
  LocationRecorder::LocationRecorder(&location,options_location,iVar3,iVar4);
  if ((local_44 != OPTION_STATEMENT) || (bVar1 = Consume(this,"option"), bVar1)) {
    iVar3 = (*(options->super_MessageLite)._vptr_MessageLite[0x12])(options);
    f = (Message *)
        (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar3) + 0x208))
                  ((long *)CONCAT44(extraout_var_01,iVar3),options,pFVar5,0);
    uninterpreted_option =
         internal::down_cast<google::protobuf::UninterpretedOption*,google::protobuf::Message>(f);
    LocationRecorder::LocationRecorder(&name_location,&location,2);
    LocationRecorder::RecordLegacyLocation
              (&name_location,&uninterpreted_option->super_Message,OPTION_NAME);
    LocationRecorder::LocationRecorder
              (&part_location,&name_location,
               (uninterpreted_option->name_).super_RepeatedPtrFieldBase.current_size_);
    bVar1 = ParseOptionNamePart(this,uninterpreted_option,&part_location);
    LocationRecorder::~LocationRecorder(&part_location);
    if (bVar1) {
LAB_00217e24:
      bVar1 = LookingAt(this,".");
      if (!bVar1) {
        LocationRecorder::~LocationRecorder(&name_location);
        bVar1 = Consume(this,"=");
        if (!bVar1) goto LAB_00217e78;
        LocationRecorder::Init(&part_location,&location);
        uVar9 = 8;
        LocationRecorder::RecordLegacyLocation
                  (&part_location,&uninterpreted_option->super_Message,OPTION_VALUE);
        bVar1 = TryConsume(this,"-");
        switch((this->input_->current_).type) {
        case TYPE_START:
          internal::LogMessage::LogMessage
                    ((LogMessage *)&name_location,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/compiler/parser.cc"
                     ,0x3f7);
          pLVar6 = internal::LogMessage::operator<<
                             ((LogMessage *)&name_location,
                              "Trying to read value before any tokens have been read.");
          internal::LogFinisher::operator=(&local_91,pLVar6);
          internal::LogMessage::~LogMessage((LogMessage *)&name_location);
          break;
        case TYPE_END:
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&name_location,"Unexpected end of stream while parsing option value."
                     ,(allocator<char> *)&local_91);
          AddError(this,(string *)&name_location);
          goto LAB_00218169;
        case TYPE_IDENTIFIER:
          SourceCodeInfo_Location::add_path(part_location.location_,3);
          if (bVar1) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&name_location,"Invalid \'-\' symbol before identifier.",
                       (allocator<char> *)&local_91);
            AddError(this,(string *)&name_location);
          }
          else {
            name_location.parser_ = (Parser *)local_70;
            name_location.location_ = (Location *)0x0;
            local_70[0]._M_local_buf[0] = '\0';
            bVar1 = ConsumeIdentifier(this,(string *)&name_location,"Expected identifier.");
            if (bVar1) {
              UninterpretedOption::set_identifier_value
                        (uninterpreted_option,(string *)&name_location);
LAB_0021813a:
              std::__cxx11::string::~string((string *)&name_location);
              goto switchD_00217f04_default;
            }
          }
          goto LAB_00218169;
        case TYPE_INTEGER:
          bVar2 = ConsumeInteger64(this,(ulong)bVar1 - 1 | 0x8000000000000000,
                                   (uint64 *)&name_location,"Expected integer.");
          if (bVar2) {
            if (bVar1) {
              SourceCodeInfo_Location::add_path(part_location.location_,5);
              lVar8 = 0x38;
              pPVar7 = (Parser *)-(long)name_location.parser_;
            }
            else {
              uVar9 = 4;
              SourceCodeInfo_Location::add_path(part_location.location_,4);
              lVar8 = 0x30;
              pPVar7 = name_location.parser_;
            }
            uninterpreted_option->_has_bits_[0] = uninterpreted_option->_has_bits_[0] | uVar9;
            *(Parser **)((long)uninterpreted_option->_has_bits_ + lVar8 + -0x5c) = pPVar7;
            goto switchD_00217f04_default;
          }
          break;
        case TYPE_FLOAT:
          SourceCodeInfo_Location::add_path(part_location.location_,6);
          bVar2 = ConsumeNumber(this,(double *)&name_location,"Expected number.");
          if (bVar2) {
            pPVar7 = name_location.parser_;
            if (bVar1) {
              pPVar7 = (Parser *)((ulong)name_location.parser_ ^ 0x8000000000000000);
            }
            uninterpreted_option->_has_bits_[0] = uninterpreted_option->_has_bits_[0] | 0x10;
            uninterpreted_option->double_value_ = (double)pPVar7;
            goto switchD_00217f04_default;
          }
          break;
        case TYPE_STRING:
          SourceCodeInfo_Location::add_path(part_location.location_,7);
          if (bVar1) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&name_location,"Invalid \'-\' symbol before string.",
                       (allocator<char> *)&local_91);
            AddError(this,(string *)&name_location);
          }
          else {
            name_location.parser_ = (Parser *)local_70;
            name_location.location_ = (Location *)0x0;
            local_70[0]._M_local_buf[0] = '\0';
            bVar1 = ConsumeString(this,(string *)&name_location,"Expected string.");
            if (bVar1) {
              UninterpretedOption::set_string_value(uninterpreted_option,(string *)&name_location);
              goto LAB_0021813a;
            }
          }
LAB_00218169:
          std::__cxx11::string::~string((string *)&name_location);
          break;
        case TYPE_SYMBOL:
          bVar1 = LookingAt(this,"{");
          if (!bVar1) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&name_location,"Expected option value.",
                       (allocator<char> *)&local_91);
            AddError(this,(string *)&name_location);
            goto LAB_00218169;
          }
          SourceCodeInfo_Location::add_path(part_location.location_,8);
          value = UninterpretedOption::mutable_aggregate_value_abi_cxx11_(uninterpreted_option);
          bVar1 = ParseUninterpretedBlock(this,value);
          if (bVar1) goto switchD_00217f04_default;
          break;
        default:
switchD_00217f04_default:
          LocationRecorder::~LocationRecorder(&part_location);
          if ((local_44 == OPTION_STATEMENT) &&
             (bVar1 = ConsumeEndOfDeclaration(this,";",&location), !bVar1)) goto LAB_00217e78;
          bVar1 = true;
          goto LAB_00217e7a;
        }
        this_00 = &part_location;
        goto LAB_00217e73;
      }
      bVar1 = Consume(this,".");
      if (bVar1) goto code_r0x00217e42;
    }
LAB_00217e6e:
    this_00 = &name_location;
LAB_00217e73:
    LocationRecorder::~LocationRecorder(this_00);
  }
LAB_00217e78:
  bVar1 = false;
LAB_00217e7a:
  LocationRecorder::~LocationRecorder(&location);
  return bVar1;
code_r0x00217e42:
  LocationRecorder::LocationRecorder
            (&part_location,&name_location,
             (uninterpreted_option->name_).super_RepeatedPtrFieldBase.current_size_);
  bVar1 = ParseOptionNamePart(this,uninterpreted_option,&part_location);
  LocationRecorder::~LocationRecorder(&part_location);
  if (!bVar1) goto LAB_00217e6e;
  goto LAB_00217e24;
}

Assistant:

bool Parser::ParseOption(Message* options,
                         const LocationRecorder& options_location,
                         OptionStyle style) {
  // Create an entry in the uninterpreted_option field.
  const FieldDescriptor* uninterpreted_option_field = options->GetDescriptor()->
      FindFieldByName("uninterpreted_option");
  GOOGLE_CHECK(uninterpreted_option_field != NULL)
      << "No field named \"uninterpreted_option\" in the Options proto.";

  const Reflection* reflection = options->GetReflection();

  LocationRecorder location(
      options_location, uninterpreted_option_field->number(),
      reflection->FieldSize(*options, uninterpreted_option_field));

  if (style == OPTION_STATEMENT) {
    DO(Consume("option"));
  }

  UninterpretedOption* uninterpreted_option = down_cast<UninterpretedOption*>(
      options->GetReflection()->AddMessage(options,
                                           uninterpreted_option_field));

  // Parse dot-separated name.
  {
    LocationRecorder name_location(location,
                                   UninterpretedOption::kNameFieldNumber);
    name_location.RecordLegacyLocation(
        uninterpreted_option, DescriptorPool::ErrorCollector::OPTION_NAME);

    {
      LocationRecorder part_location(name_location,
                                     uninterpreted_option->name_size());
      DO(ParseOptionNamePart(uninterpreted_option, part_location));
    }

    while (LookingAt(".")) {
      DO(Consume("."));
      LocationRecorder part_location(name_location,
                                     uninterpreted_option->name_size());
      DO(ParseOptionNamePart(uninterpreted_option, part_location));
    }
  }

  DO(Consume("="));

  {
    LocationRecorder value_location(location);
    value_location.RecordLegacyLocation(
        uninterpreted_option, DescriptorPool::ErrorCollector::OPTION_VALUE);

    // All values are a single token, except for negative numbers, which consist
    // of a single '-' symbol, followed by a positive number.
    bool is_negative = TryConsume("-");

    switch (input_->current().type) {
      case io::Tokenizer::TYPE_START:
        GOOGLE_LOG(FATAL) << "Trying to read value before any tokens have been read.";
        return false;

      case io::Tokenizer::TYPE_END:
        AddError("Unexpected end of stream while parsing option value.");
        return false;

      case io::Tokenizer::TYPE_IDENTIFIER: {
        value_location.AddPath(
            UninterpretedOption::kIdentifierValueFieldNumber);
        if (is_negative) {
          AddError("Invalid '-' symbol before identifier.");
          return false;
        }
        string value;
        DO(ConsumeIdentifier(&value, "Expected identifier."));
        uninterpreted_option->set_identifier_value(value);
        break;
      }

      case io::Tokenizer::TYPE_INTEGER: {
        uint64 value;
        uint64 max_value =
            is_negative ? static_cast<uint64>(kint64max) + 1 : kuint64max;
        DO(ConsumeInteger64(max_value, &value, "Expected integer."));
        if (is_negative) {
          value_location.AddPath(
              UninterpretedOption::kNegativeIntValueFieldNumber);
          uninterpreted_option->set_negative_int_value(
              -static_cast<int64>(value));
        } else {
          value_location.AddPath(
              UninterpretedOption::kPositiveIntValueFieldNumber);
          uninterpreted_option->set_positive_int_value(value);
        }
        break;
      }

      case io::Tokenizer::TYPE_FLOAT: {
        value_location.AddPath(UninterpretedOption::kDoubleValueFieldNumber);
        double value;
        DO(ConsumeNumber(&value, "Expected number."));
        uninterpreted_option->set_double_value(is_negative ? -value : value);
        break;
      }

      case io::Tokenizer::TYPE_STRING: {
        value_location.AddPath(UninterpretedOption::kStringValueFieldNumber);
        if (is_negative) {
          AddError("Invalid '-' symbol before string.");
          return false;
        }
        string value;
        DO(ConsumeString(&value, "Expected string."));
        uninterpreted_option->set_string_value(value);
        break;
      }

      case io::Tokenizer::TYPE_SYMBOL:
        if (LookingAt("{")) {
          value_location.AddPath(
              UninterpretedOption::kAggregateValueFieldNumber);
          DO(ParseUninterpretedBlock(
              uninterpreted_option->mutable_aggregate_value()));
        } else {
          AddError("Expected option value.");
          return false;
        }
        break;
    }
  }

  if (style == OPTION_STATEMENT) {
    DO(ConsumeEndOfDeclaration(";", &location));
  }

  return true;
}